

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::generateCompareFuncs(ostream *str,ShaderInterface *interface)

{
  size_t *this;
  bool bVar1;
  reference pDVar2;
  char *pcVar3;
  _Self local_b8;
  DataType local_ac;
  _Self local_a8;
  DataType local_9c;
  iterator iStack_98;
  int type;
  _Self local_90;
  const_iterator iter;
  undefined1 local_78 [8];
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> compareFuncs;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> types;
  ShaderInterface *interface_local;
  ostream *str_local;
  
  this = &compareFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::set
            ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)this);
  std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::set
            ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
             local_78);
  collectUniqueBasicTypes
            ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)this,
             interface);
  local_90._M_node =
       (_Base_ptr)
       std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::begin
                 ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                  &compareFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while( true ) {
    iStack_98 = std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::
                end((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                    &compareFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator!=(&local_90,&stack0xffffffffffffff68);
    if (!bVar1) break;
    pDVar2 = std::_Rb_tree_const_iterator<glu::DataType>::operator*(&local_90);
    getCompareDependencies
              ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
               local_78,*pDVar2);
    std::_Rb_tree_const_iterator<glu::DataType>::operator++(&local_90);
  }
  for (local_9c = TYPE_INVALID; (int)local_9c < 0x5e; local_9c = local_9c + TYPE_FLOAT) {
    local_ac = local_9c;
    local_a8._M_node =
         (_Base_ptr)
         std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::find
                   ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                    local_78,&local_ac);
    local_b8._M_node =
         (_Base_ptr)
         std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::end
                   ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                    local_78);
    bVar1 = std::operator!=(&local_a8,&local_b8);
    if (bVar1) {
      pcVar3 = getCompareFuncForType(local_9c);
      std::operator<<(str,pcVar3);
    }
  }
  std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::~set
            ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
             local_78);
  std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::~set
            ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
             &compareFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void generateCompareFuncs (std::ostream& str, const ShaderInterface& interface)
{
	std::set<glu::DataType> types;
	std::set<glu::DataType> compareFuncs;

	// Collect unique basic types
	collectUniqueBasicTypes(types, interface);

	// Set of compare functions required
	for (std::set<glu::DataType>::const_iterator iter = types.begin(); iter != types.end(); ++iter)
	{
		getCompareDependencies(compareFuncs, *iter);
	}

	for (int type = 0; type < glu::TYPE_LAST; ++type)
	{
		if (compareFuncs.find(glu::DataType(type)) != compareFuncs.end())
			str << getCompareFuncForType(glu::DataType(type));
	}
}